

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::
FormatForComparisonFailureMessage<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
          (string *__return_storage_ptr__,internal *this,vector<int,_std::allocator<int>_> *value,
          vector<int,_std::allocator<int>_> *param_2)

{
  vector<int,_std::allocator<int>_> *param_1_local;
  vector<int,_std::allocator<int>_> *value_local;
  
  PrintToString<std::vector<int,std::allocator<int>>>(__return_storage_ptr__,(iutest *)this,value);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}